

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineApiCase::checkProgInfoLog(PipelineApiCase *this,Functions *gl,GLuint pipeline)

{
  GLint GVar1;
  GLenum GVar2;
  int iVar3;
  TestError *this_00;
  GLsizei length;
  allocator_type local_3d;
  GLint value;
  vector<char,_std::allocator<char>_> infoLogBuf;
  
  (*gl->getProgramPipelineiv)(pipeline,0x8b84,&value);
  std::vector<char,_std::allocator<char>_>::vector(&infoLogBuf,(long)(value + 1),&local_3d);
  (*gl->getProgramPipelineInfoLog)
            (pipeline,0,&length,
             infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"GetProgramPipelineInfoLog failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x370);
  GVar1 = value;
  iVar3 = value / 2;
  (*gl->getProgramPipelineInfoLog)
            (pipeline,iVar3,&length,
             infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((GVar1 + 1U < 3) || (iVar3 == length + 1)) {
    (*gl->getProgramPipelineInfoLog)
              (pipeline,value,&length,
               infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if ((value == 0) || (value == length + 1)) {
      (*gl->getProgramPipelineInfoLog)
                (pipeline + 0x65,value,&length,
                 infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      GVar2 = (*gl->getError)();
      if (GVar2 == 0x501) {
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&infoLogBuf.super__Vector_base<char,_std::allocator<char>_>);
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetProgramPipelineInfoLog failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x385);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetProgramPipelineInfoLog failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x37c);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"GetProgramPipelineInfoLog failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x376);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkProgInfoLog(const glw::Functions& gl, GLuint pipeline)
	{
		glw::GLint   value;
		glw::GLsizei bufSize;
		glw::GLsizei length;
		glw::GLenum  err;

		gl.getProgramPipelineiv(pipeline, GL_INFO_LOG_LENGTH, &value);
		std::vector<char> infoLogBuf(value + 1);

		bufSize = 0;
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramPipelineInfoLog failed");

		bufSize = value / 2; // read half the log
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		if ((bufSize != 0) && (bufSize != length + 1))
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}
		bufSize = value;
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		if ((bufSize != 0) && (bufSize != length + 1))
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}

		// Negative case for GetProgramPipelineInfoLog

		gl.getProgramPipelineInfoLog(pipeline + 101, bufSize, &length, &infoLogBuf[0]);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}
	}